

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::DelKey
          (TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_> *this,int key)

{
  int iVar1;
  undefined4 uVar2;
  Node *pNVar3;
  uint uVar4;
  Node *n;
  Node *pNVar5;
  
  uVar4 = this->Size - 1 & key;
  pNVar3 = this->Nodes[uVar4].Next;
  if (pNVar3 != (Node *)0x1) {
    pNVar5 = this->Nodes + uVar4;
    if ((pNVar5->Pair).Key == key) {
      if (pNVar3 != (Node *)0x0) {
        (pNVar5->Pair).Value = (pNVar3->Pair).Value;
        iVar1 = (pNVar3->Pair).Key;
        uVar2 = *(undefined4 *)&(pNVar3->Pair).field_0x4;
        pNVar5->Next = pNVar3->Next;
        (pNVar5->Pair).Key = iVar1;
        *(undefined4 *)&(pNVar5->Pair).field_0x4 = uVar2;
        pNVar5 = pNVar3;
      }
    }
    else {
      do {
        pNVar3 = pNVar5;
        pNVar5 = pNVar3->Next;
        if (pNVar5 == (Node *)0x0) {
          return;
        }
      } while ((pNVar5->Pair).Key != key);
      pNVar3->Next = pNVar5->Next;
    }
    pNVar5->Next = (Node *)0x1;
    this->NumUsed = this->NumUsed - 1;
  }
  return;
}

Assistant:

Node *MainPosition(const KT k)
	{
		HashTraits Traits;
		return &Nodes[Traits.Hash(k) & (Size - 1)];
	}